

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_multi_test.c
# Opt level: O1

int multi_dec_simple(MpiDecMultiCtx *data)

{
  MppCtx pvVar1;
  MppApi *pMVar2;
  FileReader reader;
  MpiDecMultiCtx *pMVar3;
  char cVar4;
  MPP_RET MVar5;
  int iVar6;
  undefined4 uVar7;
  RK_U32 size;
  uint uVar8;
  uint uVar9;
  undefined4 uVar10;
  MppBufferGroup pvVar11;
  RK_S64 RVar12;
  MppPacket pvVar13;
  byte bVar14;
  undefined4 uVar15;
  ulong unaff_RBP;
  MppFrame pvVar16;
  ulong uVar17;
  bool bVar18;
  MppFrame frame;
  FileBufSlot *slot;
  int local_88;
  MppFrame local_80;
  RK_U32 local_78;
  int local_74;
  MpiDecMultiCtx *local_70;
  undefined4 local_64;
  FileBufSlot *local_60;
  MppPacket local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  MpiDecTestCmd *local_40;
  MppFrame local_38;
  
  local_40 = data->cmd;
  pvVar1 = data->ctx;
  pMVar2 = data->mpi;
  pvVar13 = data->packet;
  reader = local_40->reader;
  local_60 = (FileBufSlot *)0x0;
  iVar6 = data->packet_count;
  local_78 = data->quiet;
  data->packet_count = iVar6 + 1;
  local_58 = pvVar13;
  MVar5 = reader_index_read(reader,iVar6,&local_60);
  if (MVar5 != MPP_OK) {
    pvVar13 = (MppPacket)0x0;
    _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
               "multi_dec_simple",0x5b);
    if ((DAT_001102d3 & 0x10) != 0) goto LAB_0010521a;
  }
  if (local_60 == (FileBufSlot *)0x0) {
    pvVar13 = (MppPacket)0x0;
    _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"slot","multi_dec_simple",
               0x5c);
    if ((DAT_001102d3 & 0x10) != 0) {
LAB_0010521a:
      abort();
    }
  }
  local_64 = (undefined4)CONCAT71((int7)((ulong)pvVar13 >> 8),1);
  if (local_60->eos != 0) {
    if ((data->frame_num < 0) || (data->frame_count < data->frame_num)) {
      if (local_78 == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p loop again\n",0,pvVar1);
      }
      data->packet_count = 0;
    }
    else {
      if (local_78 == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p found last packet\n",0,pvVar1);
      }
      data->loop_end = 1;
      local_64 = 0;
    }
  }
  pvVar13 = local_58;
  mpp_packet_set_data(local_58,local_60->data);
  mpp_packet_set_size(pvVar13,local_60->size);
  mpp_packet_set_pos(pvVar13,local_60->data);
  mpp_packet_set_length(pvVar13,local_60->size);
  if ((char)local_64 == '\0') {
    mpp_packet_set_eos(local_58);
  }
  iVar6 = 0;
  local_70 = data;
  do {
    local_88 = 0;
    if (iVar6 == 0) {
      MVar5 = (*pMVar2->decode_put_packet)(pvVar1,local_58);
      if (MVar5 == MPP_OK) {
        if (data->first_pkt != 0) goto LAB_00104e0b;
        local_74 = 1;
        uVar15 = 0;
        RVar12 = mpp_time();
        data->first_pkt = RVar12;
      }
      else {
        local_74 = 0;
        uVar15 = (undefined4)CONCAT71((int7)(unaff_RBP >> 8),1);
      }
    }
    else {
LAB_00104e0b:
      local_74 = 1;
      uVar15 = 0;
    }
    cVar4 = (char)local_64;
    uVar17 = 5;
    local_50 = uVar15;
    do {
      unaff_RBP = uVar17;
      uVar8 = (uint)unaff_RBP;
      local_80 = (MppFrame)0x0;
      while( true ) {
        MVar5 = (*pMVar2->decode_get_frame)(pvVar1,&local_80);
        uVar17 = unaff_RBP;
        if (MVar5 != MPP_ERR_TIMEOUT) break;
        if ((int)unaff_RBP < 1) {
          _mpp_log_l(2,"mpi_dec_multi_test","decode_get_frame failed too much time\n",0);
          uVar17 = (ulong)((int)uVar8 >> 0x1f & uVar8);
          break;
        }
        unaff_RBP = (ulong)((int)unaff_RBP - 1);
        usleep(2000);
      }
      if (MVar5 == MPP_OK) {
        pvVar16 = local_80;
        if (local_80 != (MppFrame)0x0) {
          local_38 = local_80;
          iVar6 = mpp_frame_get_info_change();
          if (iVar6 == 0) {
            if (local_70->first_frm == 0) {
              RVar12 = mpp_time();
              local_70->first_frm = RVar12;
            }
            bVar18 = local_78 == 0;
            uVar8 = mpp_frame_get_errinfo(local_80);
            uVar9 = mpp_frame_get_discard(local_80);
            uVar9 = uVar9 | uVar8;
            unaff_RBP = (ulong)uVar9;
            if (uVar9 != 0 && bVar18) {
              uVar7 = mpp_frame_get_errinfo(local_80);
              uVar10 = mpp_frame_get_discard(local_80);
              _mpp_log_l(4,"mpi_dec_multi_test","decoder_get_frame get err info:%d discard:%d.\n",0,
                         uVar7,uVar10);
            }
            if (local_78 == 0) {
              _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get frame %d\n",0,
                         local_70->frame_count);
            }
            local_70->frame_count = local_70->frame_count + 1;
            if (uVar9 == 0 && local_70->fp_output != (FILE *)0x0) {
              dump_mpp_frame_to_file(local_80,local_70->fp_output);
            }
            fps_calc_inc(local_40->fps);
          }
          else {
            local_44 = mpp_frame_get_width(local_80);
            local_48 = mpp_frame_get_height(local_80);
            local_4c = mpp_frame_get_hor_stride(local_80);
            uVar7 = mpp_frame_get_ver_stride(local_80);
            size = mpp_frame_get_buf_size(local_80);
            if (local_78 == 0) {
              _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get info changed found\n",0);
              _mpp_log_l(4,"mpi_dec_multi_test",
                         "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,local_44,
                         local_48,local_4c,uVar7,size);
            }
            pMVar3 = local_70;
            pvVar11 = dec_buf_mgr_setup(local_70->buf_mgr,size,0x18,local_40->buf_mode);
            MVar5 = (*pMVar2->control)(pvVar1,MPP_DEC_SET_EXT_BUF_GROUP,pvVar11);
            if (MVar5 == MPP_OK) {
              pMVar3->frm_grp = pvVar11;
              bVar14 = 0;
              MVar5 = (*pMVar2->control)(pvVar1,MPP_DEC_SET_INFO_CHANGE_READY,(MppParam)0x0);
              if (MVar5 != MPP_OK) {
                _mpp_log_l(2,"mpi_dec_multi_test","info change ready failed ret %d\n",0,MVar5);
                goto LAB_00105118;
              }
              unaff_RBP = CONCAT71((int7)((ulong)pMVar3 >> 8),1);
            }
            else {
              _mpp_log_l(2,"mpi_dec_multi_test","%p set buffer group failed ret %d\n",0,pvVar1,MVar5
                        );
LAB_00105118:
              unaff_RBP = 0;
              bVar14 = 0x10;
            }
            if ((char)unaff_RBP == '\0') goto LAB_00105196;
          }
          local_88 = mpp_frame_get_eos(local_80);
          mpp_frame_deinit(&local_80);
          pvVar16 = local_38;
        }
        if (local_88 == 0 && (cVar4 == '\0' && (char)uVar15 == '\0')) {
          usleep(1000);
          local_88 = 0;
          bVar14 = 0x11;
        }
        else {
          iVar6 = local_70->frame_num;
          if ((iVar6 < 1) || (bVar14 = 0x10, local_70->frame_count < iVar6)) {
            bVar14 = (iVar6 == 0 && local_88 != 0 || pvVar16 == (MppFrame)0x0) ^ 0x11;
          }
        }
      }
      else {
        _mpp_log_l(2,"mpi_dec_multi_test","decode_get_frame failed ret %d\n",0,MVar5);
        bVar14 = 0x10;
      }
LAB_00105196:
      data = local_70;
    } while (bVar14 != 0x10);
    iVar6 = local_70->frame_num;
    if (((0 < iVar6) && (iVar6 <= local_70->frame_count)) || ((iVar6 == 0 && (local_88 != 0)))) {
      local_70->loop_end = 1;
      return iVar6;
    }
    if ((char)local_50 == '\0') {
      return iVar6;
    }
    usleep(1000);
    iVar6 = local_74;
  } while( true );
}

Assistant:

static int multi_dec_simple(MpiDecMultiCtx *data)
{
    MpiDecTestCmd *cmd = data->cmd;
    RK_U32 pkt_done = 0;
    RK_U32 pkt_eos  = 0;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    MppPacket packet = data->packet;
    FileReader reader = cmd->reader;
    FileBufSlot *slot = NULL;
    RK_U32 quiet = data->quiet;
    MPP_RET ret = reader_index_read(reader, data->packet_count++, &slot);

    mpp_assert(ret == MPP_OK);
    mpp_assert(slot);

    pkt_eos = slot->eos;

    if (pkt_eos) {
        if (data->frame_num < 0 || data->frame_num > data->frame_count) {
            mpp_log_q(quiet, "%p loop again\n", ctx);
            data->packet_count = 0;
            pkt_eos = 0;
        } else {
            mpp_log_q(quiet, "%p found last packet\n", ctx);
            data->loop_end = 1;
        }
    }

    mpp_packet_set_data(packet, slot->data);
    mpp_packet_set_size(packet, slot->size);
    mpp_packet_set_pos(packet, slot->data);
    mpp_packet_set_length(packet, slot->size);
    // setup eos flag
    if (pkt_eos)
        mpp_packet_set_eos(packet);

    do {
        RK_U32 frm_eos = 0;
        RK_S32 times = 5;
        // send the packet first if packet is not done
        if (!pkt_done) {
            ret = mpi->decode_put_packet(ctx, packet);
            if (MPP_OK == ret) {
                pkt_done = 1;
                if (!data->first_pkt)
                    data->first_pkt = mpp_time();
            }
        }

        // then get all available frame and release
        do {
            RK_S32 get_frm = 0;
            MppFrame frame = NULL;

        try_again:
            ret = mpi->decode_get_frame(ctx, &frame);
            if (MPP_ERR_TIMEOUT == ret) {
                if (times > 0) {
                    times--;
                    msleep(2);
                    goto try_again;
                }
                mpp_err("decode_get_frame failed too much time\n");
            }
            if (ret) {
                mpp_err("decode_get_frame failed ret %d\n", ret);
                break;
            }

            if (frame) {
                if (mpp_frame_get_info_change(frame)) {
                    RK_U32 width = mpp_frame_get_width(frame);
                    RK_U32 height = mpp_frame_get_height(frame);
                    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
                    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
                    RK_U32 buf_size = mpp_frame_get_buf_size(frame);
                    MppBufferGroup grp = NULL;

                    mpp_log_q(quiet, "decode_get_frame get info changed found\n");
                    mpp_log_q(quiet, "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",
                              width, height, hor_stride, ver_stride, buf_size);

                    grp = dec_buf_mgr_setup(data->buf_mgr, buf_size, 24, cmd->buf_mode);
                    /* Set buffer to mpp decoder */
                    ret = mpi->control(ctx, MPP_DEC_SET_EXT_BUF_GROUP, grp);
                    if (ret) {
                        mpp_err("%p set buffer group failed ret %d\n", ctx, ret);
                        break;
                    }
                    data->frm_grp = grp;

                    /*
                     * All buffer group config done. Set info change ready to let
                     * decoder continue decoding
                     */
                    ret = mpi->control(ctx, MPP_DEC_SET_INFO_CHANGE_READY, NULL);
                    if (ret) {
                        mpp_err("info change ready failed ret %d\n", ret);
                        break;
                    }
                } else {
                    RK_U32 err_info = 0;

                    if (!data->first_frm)
                        data->first_frm = mpp_time();

                    err_info = mpp_frame_get_errinfo(frame) |
                               mpp_frame_get_discard(frame);
                    if (err_info) {
                        mpp_log_q(quiet, "decoder_get_frame get err info:%d discard:%d.\n",
                                  mpp_frame_get_errinfo(frame),
                                  mpp_frame_get_discard(frame));
                    }
                    mpp_log_q(quiet, "decode_get_frame get frame %d\n",
                              data->frame_count);

                    data->frame_count++;
                    if (data->fp_output && !err_info)
                        dump_mpp_frame_to_file(frame, data->fp_output);

                    fps_calc_inc(cmd->fps);
                }
                frm_eos = mpp_frame_get_eos(frame);
                mpp_frame_deinit(&frame);
                get_frm = 1;
            }

            // if last packet is send but last frame is not found continue
            if (pkt_eos && pkt_done && !frm_eos) {
                msleep(1);
                continue;
            }

            if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
                ((data->frame_num == 0) && frm_eos))
                break;

            if (get_frm)
                continue;
            break;
        } while (1);

        if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
            ((data->frame_num == 0) && frm_eos)) {
            data->loop_end = 1;
            break;
        }

        if (pkt_done)
            break;

        /*
         * why sleep here:
         * mpi->decode_put_packet will failed when packet in internal queue is
         * full,waiting the package is consumed .Usually hardware decode one
         * frame which resolution is 1080p needs 2 ms,so here we sleep 3ms
         * * is enough.
         */
        msleep(1);
    } while (1);

    return ret;
}